

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::SurfaceMesh::SurfaceMesh(SurfaceMesh *this,bool useImplicitTwin)

{
  byte in_SIL;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SurfaceMesh_00989718;
  ::std::__cxx11::
  list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>::
  list((list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
        *)0x1c4632);
  ::std::__cxx11::
  list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>::
  list((list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
        *)0x1c463f);
  ::std::__cxx11::
  list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>::
  list((list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
        *)0x1c464c);
  ::std::__cxx11::
  list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>::
  list((list<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
        *)0x1c4659);
  ::std::__cxx11::
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ::list((list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
          *)0x1c4666);
  ::std::__cxx11::
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ::list((list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
          *)0x1c4676);
  ::std::__cxx11::
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ::list((list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
          *)0x1c4686);
  ::std::__cxx11::
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ::list((list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
          *)0x1c4696);
  ::std::__cxx11::
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ::list((list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
          *)0x1c46a6);
  ::std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::list
            ((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)0x1c46b6);
  ::std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::list
            ((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)0x1c46c6);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c46d6);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c46e6);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c46f6);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c4706);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c4716);
  *(byte *)(in_RDI + 0x31) = in_SIL & 1;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c4732);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c4742);
  ::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)0x1c4752);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c4762);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c4772);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c4782);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c4792);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c47a2);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c47b2);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1c47c2);
  in_RDI[0x50] = 0;
  in_RDI[0x51] = 0;
  in_RDI[0x52] = 0;
  in_RDI[0x53] = 0;
  in_RDI[0x54] = 0;
  in_RDI[0x55] = 0;
  in_RDI[0x56] = 0;
  in_RDI[0x57] = 0;
  in_RDI[0x58] = 0;
  in_RDI[0x59] = 0;
  in_RDI[0x5a] = 0;
  in_RDI[0x5b] = 0;
  in_RDI[0x5c] = 0;
  in_RDI[0x5d] = 0;
  in_RDI[0x5e] = 0;
  *(undefined1 *)(in_RDI + 0x5f) = 1;
  in_RDI[0x60] = 1;
  return;
}

Assistant:

SurfaceMesh::SurfaceMesh(bool useImplicitTwin) : useImplicitTwinFlag(useImplicitTwin) {}